

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O1

string * __thiscall
QStringConverterICU::nul_terminate_abi_cxx11_
          (string *__return_storage_ptr__,QStringConverterICU *this,QAnyStringView name)

{
  if (this == (QStringConverterICU *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,this,
               (long)&(this->super_QStringConverter).iface +
               ((ulong)name.field_0.m_data & 0x3fffffffffffffff));
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string nul_terminate(QAnyStringView name)
    { return name.visit([](auto name) { return nul_terminate_impl(name); }); }